

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O0

Embargo __thiscall
capnp::_::anon_unknown_18::
ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Embargo>::erase
          (ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Embargo> *this,
          uint id,Embargo *entry)

{
  bool bVar1;
  Entry **ppEVar2;
  Embargo *pEVar3;
  Entry *in_RCX;
  PromiseFulfiller<void> *extraout_RDX;
  PromiseFulfiller<void> *extraout_RDX_00;
  PromiseFulfiller<void> *pPVar4;
  undefined4 in_register_00000034;
  ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Embargo> *this_00;
  Embargo EVar5;
  Embargo local_d8;
  undefined1 local_c1;
  Fault local_c0;
  Fault f;
  Entry *local_b0;
  Embargo *local_a8;
  undefined1 local_a0 [8];
  DebugComparison<capnp::_::RpcSystemBase::RpcConnectionState::Embargo_*,_capnp::_::RpcSystemBase::RpcConnectionState::Embargo_*>
  _kjCondition;
  Embargo EStack_70;
  Entry *local_60;
  Fault local_48;
  Maybe<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Embargo>::Entry_&>
  local_40;
  Entry *local_38;
  Entry *_kj_result;
  Entry *slot;
  Embargo *entry_local;
  ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Embargo> *pEStack_18;
  uint id_local;
  ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Embargo> *this_local;
  Embargo *toRelease;
  
  this_00 = (ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Embargo> *)
            CONCAT44(in_register_00000034,id);
  entry_local._4_4_ = (uint)entry;
  slot = in_RCX;
  pEStack_18 = this_00;
  this_local = this;
  bVar1 = isHigh(this_00,(uint *)((long)&entry_local + 4));
  if (bVar1) {
    kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Embargo>::
    findEntry<unsigned_int&>
              ((HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Embargo> *)
               &local_40,(uint *)&this_00->highSlots);
    local_38 = kj::_::
               readMaybe<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Embargo>::Entry>
                         (&local_40);
    if (local_38 == (Entry *)0x0) {
      kj::_::Debug::Fault::Fault
                (&local_48,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
                 ,0xed,FAILED,"highSlots.findEntry(id) != nullptr","");
      kj::_::Debug::Fault::fatal(&local_48);
    }
    ppEVar2 = kj::
              mv<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Embargo>::Entry*>
                        (&local_38);
    local_60 = *ppEVar2;
    _kj_result = local_60;
    kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Embargo>::release
              ((Entry *)&_kjCondition.result,&this_00->highSlots,local_60);
    RpcSystemBase::RpcConnectionState::Embargo::Embargo((Embargo *)this,&EStack_70);
    kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Embargo>::Entry::~Entry
              ((Entry *)&_kjCondition.result);
    pPVar4 = extraout_RDX;
  }
  else {
    local_b0 = slot;
    local_a8 = (Embargo *)
               kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(Embargo **)&local_b0);
    f.exception = (Exception *)
                  kj::Vector<capnp::_::RpcSystemBase::RpcConnectionState::Embargo>::operator[]
                            ((Vector<capnp::_::RpcSystemBase::RpcConnectionState::Embargo> *)this_00
                             ,(ulong)entry_local._4_4_);
    kj::_::DebugExpression<capnp::_::RpcSystemBase::RpcConnectionState::Embargo*>::operator==
              ((DebugComparison<capnp::_::RpcSystemBase::RpcConnectionState::Embargo_*,_capnp::_::RpcSystemBase::RpcConnectionState::Embargo_*>
                *)local_a0,
               (DebugExpression<capnp::_::RpcSystemBase::RpcConnectionState::Embargo*> *)&local_a8,
               (Embargo **)&f);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_a0);
    if (!bVar1) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::RpcSystemBase::RpcConnectionState::Embargo*,capnp::_::RpcSystemBase::RpcConnectionState::Embargo*>&>
                (&local_c0,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
                 ,0xf0,FAILED,"&entry == &slots[id]","_kjCondition,",
                 (DebugComparison<capnp::_::RpcSystemBase::RpcConnectionState::Embargo_*,_capnp::_::RpcSystemBase::RpcConnectionState::Embargo_*>
                  *)local_a0);
      kj::_::Debug::Fault::fatal(&local_c0);
    }
    local_c1 = 0;
    pEVar3 = kj::Vector<capnp::_::RpcSystemBase::RpcConnectionState::Embargo>::operator[]
                       ((Vector<capnp::_::RpcSystemBase::RpcConnectionState::Embargo> *)this_00,
                        (ulong)entry_local._4_4_);
    pEVar3 = kj::mv<capnp::_::RpcSystemBase::RpcConnectionState::Embargo>(pEVar3);
    RpcSystemBase::RpcConnectionState::Embargo::Embargo((Embargo *)this,pEVar3);
    local_d8.fulfiller.ptr.disposer = (Disposer *)0x0;
    local_d8.fulfiller.ptr.ptr = (PromiseFulfiller<void> *)0x0;
    RpcSystemBase::RpcConnectionState::Embargo::Embargo(&local_d8);
    pEVar3 = kj::Vector<capnp::_::RpcSystemBase::RpcConnectionState::Embargo>::operator[]
                       ((Vector<capnp::_::RpcSystemBase::RpcConnectionState::Embargo> *)this_00,
                        (ulong)entry_local._4_4_);
    RpcSystemBase::RpcConnectionState::Embargo::operator=(pEVar3,&local_d8);
    RpcSystemBase::RpcConnectionState::Embargo::~Embargo(&local_d8);
    std::
    priority_queue<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::greater<unsigned_int>_>
    ::push(&this_00->freeIds,(value_type *)((long)&entry_local + 4));
    pPVar4 = extraout_RDX_00;
  }
  EVar5.fulfiller.ptr.ptr = pPVar4;
  EVar5.fulfiller.ptr.disposer = (Disposer *)this;
  return (Embargo)EVar5.fulfiller.ptr;
}

Assistant:

T erase(Id id, T& entry) {
    // Remove an entry from the table and return it.  We return it so that the caller can be
    // careful to release it (possibly invoking arbitrary destructors) at a time that makes sense.
    // `entry` is a reference to the entry being released -- we require this in order to prove
    // that the caller has already done a find() to check that this entry exists.  We can't check
    // ourselves because the caller may have nullified the entry in the meantime.

    if (isHigh(id)) {
      auto& slot = KJ_REQUIRE_NONNULL(highSlots.findEntry(id));
      return highSlots.release(slot).value;
    } else {
      KJ_DREQUIRE(&entry == &slots[id]);
      T toRelease = kj::mv(slots[id]);
      slots[id] = T();
      freeIds.push(id);
      return toRelease;
    }
  }